

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_capability.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_3::IsSupportGuaranteedOpenCL_2_0
               (uint32_t capability,bool embedded_profile)

{
  bool bVar1;
  bool embedded_profile_local;
  uint32_t capability_local;
  
  bVar1 = IsSupportGuaranteedOpenCL_1_2(capability,embedded_profile);
  if (bVar1) {
    embedded_profile_local = true;
  }
  else if ((capability - 0x11 < 3) || (capability == 0x26)) {
    embedded_profile_local = true;
  }
  else {
    embedded_profile_local = false;
  }
  return embedded_profile_local;
}

Assistant:

bool IsSupportGuaranteedOpenCL_2_0(uint32_t capability, bool embedded_profile) {
  if (IsSupportGuaranteedOpenCL_1_2(capability, embedded_profile)) return true;

  switch (spv::Capability(capability)) {
    case spv::Capability::DeviceEnqueue:
    case spv::Capability::GenericPointer:
    case spv::Capability::Groups:
    case spv::Capability::Pipes:
      return true;
    default:
      break;
  }
  return false;
}